

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_planesurface.h
# Opt level: O0

ON_ClippingPlaneSurface * __thiscall
ON_ClippingPlaneSurface::operator=(ON_ClippingPlaneSurface *this,ON_ClippingPlaneSurface *param_1)

{
  ON_ClippingPlaneSurface *param_1_local;
  ON_ClippingPlaneSurface *this_local;
  
  ON_PlaneSurface::operator=(&this->super_ON_PlaneSurface,&param_1->super_ON_PlaneSurface);
  ON_ClippingPlane::operator=(&this->m_clipping_plane,&param_1->m_clipping_plane);
  return this;
}

Assistant:

class ON_CLASS ON_ClippingPlaneSurface : public ON_PlaneSurface
{
  ON_OBJECT_DECLARE(ON_ClippingPlaneSurface);
public:
  ON_ClippingPlaneSurface();
  ON_ClippingPlaneSurface(const ON_Plane& src);
  ON_ClippingPlaneSurface(const ON_PlaneSurface& src);
  ~ON_ClippingPlaneSurface();

  ON_ClippingPlaneSurface& operator=(const ON_Plane& src);
  ON_ClippingPlaneSurface& operator=(const ON_PlaneSurface& src);

  void Default();

  // override ON_Object::ObjectType() - returns ON::clipplane_object
  ON::object_type ObjectType() const override;

  // virtual ON_Object::SizeOf override
  unsigned int SizeOf() const override;

  // virtual ON_Object::DataCRC override
  ON__UINT32 DataCRC(ON__UINT32 current_remainder) const override;

  // virtual ON_Object::Dump override
  void Dump( ON_TextLog& ) const override; // for debugging

  // virtual ON_Object::Write override
  bool Write(
         ON_BinaryArchive&  // open binary file
       ) const override;

  // virtual ON_Object::Read override
  bool Read(
         ON_BinaryArchive&  // open binary file
       ) override;

  ON_ClippingPlane m_clipping_plane;
}